

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

double polymul_internal::polynomial_evaluator<double,_double,_2,_2>::eval(double *p,double *x)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  
  iVar7 = binomial(3,1);
  pdVar1 = p + iVar7;
  dVar2 = x[1];
  dVar3 = pdVar1[1];
  dVar4 = *x;
  dVar5 = *pdVar1;
  iVar7 = binomial(2,1);
  dVar6 = x[1];
  return *x * p[1] + dVar6 * p[2] + *p +
         (dVar5 * dVar4 + dVar2 * dVar3) * dVar4 + dVar6 * dVar6 * pdVar1[iVar7];
}

Assistant:

static vartype eval(const numtype p[], const vartype x[]) {
    return polynomial_evaluator<numtype, vartype, Nvar, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 1, Ndeg - 1), x) +
           polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval(p, x);
  }